

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbb.cc
# Opt level: O0

void CBB_discard_child(CBB *cbb)

{
  cbb_buffer_st *pcVar1;
  cbb_buffer_st *base;
  CBB *cbb_local;
  
  if (cbb->child != (CBB *)0x0) {
    pcVar1 = cbb_get_base(cbb);
    if (cbb->child->is_child == '\0') {
      __assert_fail("cbb->child->is_child",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/cbb.cc"
                    ,0x1dd,"void CBB_discard_child(CBB *)");
    }
    pcVar1->len = (cbb->child->u).base.len;
    (cbb->child->u).base.buf = (uint8_t *)0x0;
    cbb->child = (CBB *)0x0;
  }
  return;
}

Assistant:

void CBB_discard_child(CBB *cbb) {
  if (cbb->child == NULL) {
    return;
  }

  struct cbb_buffer_st *base = cbb_get_base(cbb);
  assert(cbb->child->is_child);
  base->len = cbb->child->u.child.offset;

  cbb->child->u.child.base = NULL;
  cbb->child = NULL;
}